

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool __thiscall
SQFunctionProto::Save(SQFunctionProto *this,SQVM *v,SQUserPointer up,SQWRITEFUNC write)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  SQUserPointer in_RCX;
  SQVM *in_RDX;
  SQFunctionProto *in_RSI;
  SQObjectPtr *in_RDI;
  SQLocalVarInfo *lvi;
  SQInteger ndefaultparams;
  SQInteger nfunctions;
  SQInteger ninstructions;
  SQInteger nlineinfos;
  SQInteger nlocalvarinfos;
  SQInteger noutervalues;
  SQInteger nparameters;
  SQInteger nliterals;
  SQInteger i;
  undefined4 in_stack_ffffffffffffff78;
  SQUnsignedInteger32 in_stack_ffffffffffffff7c;
  SQWRITEFUNC in_stack_ffffffffffffff88;
  HSQUIRRELVM v_00;
  HSQUIRRELVM v_01;
  long lVar5;
  long lVar6;
  SQWRITEFUNC write_00;
  bool local_1;
  
  lVar6 = in_RDI[8].super_SQObject._unVal.nInteger;
  lVar1 = in_RDI[9].super_SQObject._unVal.nInteger;
  lVar2 = in_RDI[0xb].super_SQObject._unVal.nInteger;
  lVar3 = in_RDI[6].super_SQObject._unVal.nInteger;
  v_01 = (HSQUIRRELVM)in_RDI[10].super_SQObject._unVal.pTable;
  v_00 = (HSQUIRRELVM)in_RDI[0xc].super_SQObject._unVal.pTable;
  bVar4 = WriteTag(v_00,in_stack_ffffffffffffff88,in_RDI,in_stack_ffffffffffffff7c);
  if (bVar4) {
    bVar4 = WriteObject(v_01,v_00,in_stack_ffffffffffffff88,in_RDI);
    if (bVar4) {
      bVar4 = WriteObject(v_01,v_00,in_stack_ffffffffffffff88,in_RDI);
      if (bVar4) {
        bVar4 = WriteTag(v_00,in_stack_ffffffffffffff88,in_RDI,in_stack_ffffffffffffff7c);
        if (bVar4) {
          bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,in_stack_ffffffffffffff88,in_RDI,
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          if (bVar4) {
            bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,in_stack_ffffffffffffff88,in_RDI,
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
            if (bVar4) {
              bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,in_stack_ffffffffffffff88,in_RDI,
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
              if (bVar4) {
                bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,in_stack_ffffffffffffff88,in_RDI,
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
                if (bVar4) {
                  bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,in_stack_ffffffffffffff88,in_RDI,
                                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
                  if (bVar4) {
                    bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,in_stack_ffffffffffffff88,in_RDI,
                                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
                    ;
                    if (bVar4) {
                      bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,in_stack_ffffffffffffff88,in_RDI,
                                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                ));
                      if (bVar4) {
                        bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,in_stack_ffffffffffffff88,in_RDI,
                                          CONCAT44(in_stack_ffffffffffffff7c,
                                                   in_stack_ffffffffffffff78));
                        if (bVar4) {
                          bVar4 = WriteTag(v_00,in_stack_ffffffffffffff88,in_RDI,
                                           in_stack_ffffffffffffff7c);
                          if (bVar4) {
                            for (lVar5 = 0; lVar5 < lVar6; lVar5 = lVar5 + 1) {
                              bVar4 = WriteObject(v_01,v_00,in_stack_ffffffffffffff88,in_RDI);
                              if (!bVar4) {
                                return false;
                              }
                            }
                            bVar4 = WriteTag(v_00,in_stack_ffffffffffffff88,in_RDI,
                                             in_stack_ffffffffffffff7c);
                            if (bVar4) {
                              for (lVar6 = 0; lVar6 < lVar1; lVar6 = lVar6 + 1) {
                                bVar4 = WriteObject(v_01,v_00,in_stack_ffffffffffffff88,in_RDI);
                                if (!bVar4) {
                                  return false;
                                }
                              }
                              bVar4 = WriteTag(v_00,in_stack_ffffffffffffff88,in_RDI,
                                               in_stack_ffffffffffffff7c);
                              if (bVar4) {
                                for (lVar6 = 0; lVar6 < lVar2; lVar6 = lVar6 + 1) {
                                  bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,in_stack_ffffffffffffff88
                                                    ,in_RDI,CONCAT44(in_stack_ffffffffffffff7c,
                                                                     in_stack_ffffffffffffff78));
                                  if (!bVar4) {
                                    return false;
                                  }
                                  bVar4 = WriteObject(v_01,v_00,in_stack_ffffffffffffff88,in_RDI);
                                  if (!bVar4) {
                                    return false;
                                  }
                                  bVar4 = WriteObject(v_01,v_00,in_stack_ffffffffffffff88,in_RDI);
                                  if (!bVar4) {
                                    return false;
                                  }
                                }
                                bVar4 = WriteTag(v_00,in_stack_ffffffffffffff88,in_RDI,
                                                 in_stack_ffffffffffffff7c);
                                if (bVar4) {
                                  for (lVar6 = 0; lVar6 < lVar3; lVar6 = lVar6 + 1) {
                                    in_stack_ffffffffffffff88 =
                                         (SQWRITEFUNC)
                                         (*(long *)&in_RDI[7].super_SQObject + lVar6 * 0x28);
                                    bVar4 = WriteObject(v_01,v_00,in_stack_ffffffffffffff88,in_RDI);
                                    if (!bVar4) {
                                      return false;
                                    }
                                    bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,
                                                      in_stack_ffffffffffffff88,in_RDI,
                                                      CONCAT44(in_stack_ffffffffffffff7c,
                                                               in_stack_ffffffffffffff78));
                                    if (!bVar4) {
                                      return false;
                                    }
                                    bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,
                                                      in_stack_ffffffffffffff88,in_RDI,
                                                      CONCAT44(in_stack_ffffffffffffff7c,
                                                               in_stack_ffffffffffffff78));
                                    if (!bVar4) {
                                      return false;
                                    }
                                    bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,
                                                      in_stack_ffffffffffffff88,in_RDI,
                                                      CONCAT44(in_stack_ffffffffffffff7c,
                                                               in_stack_ffffffffffffff78));
                                    if (!bVar4) {
                                      return false;
                                    }
                                  }
                                  bVar4 = WriteTag(v_00,in_stack_ffffffffffffff88,in_RDI,
                                                   in_stack_ffffffffffffff7c);
                                  if (bVar4) {
                                    bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,
                                                      in_stack_ffffffffffffff88,in_RDI,
                                                      CONCAT44(in_stack_ffffffffffffff7c,
                                                               in_stack_ffffffffffffff78));
                                    if (bVar4) {
                                      bVar4 = WriteTag(v_00,in_stack_ffffffffffffff88,in_RDI,
                                                       in_stack_ffffffffffffff7c);
                                      if (bVar4) {
                                        bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,
                                                          in_stack_ffffffffffffff88,in_RDI,
                                                          CONCAT44(in_stack_ffffffffffffff7c,
                                                                   in_stack_ffffffffffffff78));
                                        if (bVar4) {
                                          bVar4 = WriteTag(v_00,in_stack_ffffffffffffff88,in_RDI,
                                                           in_stack_ffffffffffffff7c);
                                          if (bVar4) {
                                            bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,
                                                              in_stack_ffffffffffffff88,in_RDI,
                                                              CONCAT44(in_stack_ffffffffffffff7c,
                                                                       in_stack_ffffffffffffff78));
                                            if (bVar4) {
                                              bVar4 = WriteTag(v_00,in_stack_ffffffffffffff88,in_RDI
                                                               ,in_stack_ffffffffffffff7c);
                                              if (bVar4) {
                                                for (write_00 = (SQWRITEFUNC)0x0;
                                                    (long)write_00 < (long)v_01;
                                                    write_00 = write_00 + 1) {
                                                  bVar4 = Save(in_RSI,in_RDX,in_RCX,write_00);
                                                  if (!bVar4) {
                                                    return false;
                                                  }
                                                }
                                                bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,
                                                                  in_stack_ffffffffffffff88,in_RDI,
                                                                  CONCAT44(in_stack_ffffffffffffff7c
                                                                           ,
                                                  in_stack_ffffffffffffff78));
                                                if (bVar4) {
                                                  bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,
                                                                    in_stack_ffffffffffffff88,in_RDI
                                                                    ,CONCAT44(
                                                  in_stack_ffffffffffffff7c,
                                                  in_stack_ffffffffffffff78));
                                                  if (bVar4) {
                                                    bVar4 = SafeWrite(v_01,(SQWRITEFUNC)v_00,
                                                                      in_stack_ffffffffffffff88,
                                                                      in_RDI,CONCAT44(
                                                  in_stack_ffffffffffffff7c,
                                                  in_stack_ffffffffffffff78));
                                                  if (bVar4) {
                                                    local_1 = true;
                                                  }
                                                  else {
                                                    local_1 = false;
                                                  }
                                                  }
                                                  else {
                                                    local_1 = false;
                                                  }
                                                }
                                                else {
                                                  local_1 = false;
                                                }
                                              }
                                              else {
                                                local_1 = false;
                                              }
                                            }
                                            else {
                                              local_1 = false;
                                            }
                                          }
                                          else {
                                            local_1 = false;
                                          }
                                        }
                                        else {
                                          local_1 = false;
                                        }
                                      }
                                      else {
                                        local_1 = false;
                                      }
                                    }
                                    else {
                                      local_1 = false;
                                    }
                                  }
                                  else {
                                    local_1 = false;
                                  }
                                }
                                else {
                                  local_1 = false;
                                }
                              }
                              else {
                                local_1 = false;
                              }
                            }
                            else {
                              local_1 = false;
                            }
                          }
                          else {
                            local_1 = false;
                          }
                        }
                        else {
                          local_1 = false;
                        }
                      }
                      else {
                        local_1 = false;
                      }
                    }
                    else {
                      local_1 = false;
                    }
                  }
                  else {
                    local_1 = false;
                  }
                }
                else {
                  local_1 = false;
                }
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQFunctionProto::Save(SQVM *v,SQUserPointer up,SQWRITEFUNC write)
{
    SQInteger i,nliterals = _nliterals,nparameters = _nparameters;
    SQInteger noutervalues = _noutervalues,nlocalvarinfos = _nlocalvarinfos;
    SQInteger nlineinfos=_nlineinfos,ninstructions = _ninstructions,nfunctions=_nfunctions;
    SQInteger ndefaultparams = _ndefaultparams;
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(WriteObject(v,up,write,_sourcename));
    _CHECK_IO(WriteObject(v,up,write,_name));
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,&nliterals,sizeof(nliterals)));
    _CHECK_IO(SafeWrite(v,write,up,&nparameters,sizeof(nparameters)));
    _CHECK_IO(SafeWrite(v,write,up,&noutervalues,sizeof(noutervalues)));
    _CHECK_IO(SafeWrite(v,write,up,&nlocalvarinfos,sizeof(nlocalvarinfos)));
    _CHECK_IO(SafeWrite(v,write,up,&nlineinfos,sizeof(nlineinfos)));
    _CHECK_IO(SafeWrite(v,write,up,&ndefaultparams,sizeof(ndefaultparams)));
    _CHECK_IO(SafeWrite(v,write,up,&ninstructions,sizeof(ninstructions)));
    _CHECK_IO(SafeWrite(v,write,up,&nfunctions,sizeof(nfunctions)));
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nliterals;i++){
        _CHECK_IO(WriteObject(v,up,write,_literals[i]));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nparameters;i++){
        _CHECK_IO(WriteObject(v,up,write,_parameters[i]));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<noutervalues;i++){
        _CHECK_IO(SafeWrite(v,write,up,&_outervalues[i]._type,sizeof(SQUnsignedInteger)));
        _CHECK_IO(WriteObject(v,up,write,_outervalues[i]._src));
        _CHECK_IO(WriteObject(v,up,write,_outervalues[i]._name));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nlocalvarinfos;i++){
        SQLocalVarInfo &lvi=_localvarinfos[i];
        _CHECK_IO(WriteObject(v,up,write,lvi._name));
        _CHECK_IO(SafeWrite(v,write,up,&lvi._pos,sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeWrite(v,write,up,&lvi._start_op,sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeWrite(v,write,up,&lvi._end_op,sizeof(SQUnsignedInteger)));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,_lineinfos,sizeof(SQLineInfo)*nlineinfos));

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,_defaultparams,sizeof(SQInteger)*ndefaultparams));

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,_instructions,sizeof(SQInstruction)*ninstructions));

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nfunctions;i++){
        _CHECK_IO(_funcproto(_functions[i])->Save(v,up,write));
    }
    _CHECK_IO(SafeWrite(v,write,up,&_stacksize,sizeof(_stacksize)));
    _CHECK_IO(SafeWrite(v,write,up,&_bgenerator,sizeof(_bgenerator)));
    _CHECK_IO(SafeWrite(v,write,up,&_varparams,sizeof(_varparams)));
    return true;
}